

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPLYImportExport.cpp
# Opt level: O0

void __thiscall
utPLYImportExport_vertexColorTest_Test::utPLYImportExport_vertexColorTest_Test
          (utPLYImportExport_vertexColorTest_Test *this)

{
  utPLYImportExport_vertexColorTest_Test *this_local;
  
  utPLYImportExport::utPLYImportExport(&this->super_utPLYImportExport);
  (this->super_utPLYImportExport).super_AbstractImportExportBase.super_Test._vptr_Test =
       (_func_int **)&PTR__utPLYImportExport_vertexColorTest_Test_0103b060;
  return;
}

Assistant:

TEST_F( utPLYImportExport, vertexColorTest ) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/PLY/float-color.ply", aiProcess_ValidateDataStructure);
    EXPECT_NE( nullptr, scene );
    EXPECT_EQ(1u, scene->mMeshes[0]->mNumFaces);
    EXPECT_EQ(aiPrimitiveType_TRIANGLE, scene->mMeshes[0]->mPrimitiveTypes);
    EXPECT_EQ(true, scene->mMeshes[0]->HasVertexColors(0));

    auto first_face = scene->mMeshes[0]->mFaces[0];
    EXPECT_EQ(3u, first_face.mNumIndices);
    EXPECT_EQ(0u, first_face.mIndices[0]);
    EXPECT_EQ(1u, first_face.mIndices[1]);
    EXPECT_EQ(2u, first_face.mIndices[2]);
}